

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLExtensionHandler.cpp
# Opt level: O1

bool __thiscall
irr::video::COpenGLExtensionHandler::queryFeature
          (COpenGLExtensionHandler *this,E_VIDEO_DRIVER_FEATURE feature)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = 1;
  switch(feature) {
  case EVDF_RENDER_TO_TARGET:
  case EVDF_HARDWARE_TL:
  case EVDF_BILINEAR_FILTER:
  case EVDF_MIP_MAP:
  case EVDF_TEXTURE_NSQUARE:
  case EVDF_COLOR_MASK:
  case EVDF_TEXTURE_MATRIX:
    break;
  case EVDF_MULTITEXTURE:
    bVar2 = (this->Feature).MaxTextureUnits < 2;
    goto LAB_001f21d5;
  case EVDF_MIP_MAP_AUTO_UPDATE:
    if (this->IsAtiRadeonX == false) {
      if ((this->FeatureAvailable[0x1a1] == false) && (this->FeatureAvailable[0xe6] == false)) {
        bVar1 = this->FeatureAvailable[0x4f];
      }
      break;
    }
  default:
    bVar1 = 0;
    break;
  case EVDF_STENCIL_BUFFER:
    bVar1 = this->StencilBuffer;
    break;
  case EVDF_VERTEX_SHADER_1_1:
  case EVDF_ARB_VERTEX_PROGRAM_1:
    bVar1 = this->FeatureAvailable[0x189] | this->FeatureAvailable[0xb3];
    break;
  case EVDF_VERTEX_SHADER_2_0:
  case EVDF_PIXEL_SHADER_2_0:
  case EVDF_ARB_GLSL:
    bVar1 = 199 < this->Version | this->FeatureAvailable[0x80];
    break;
  case EVDF_PIXEL_SHADER_1_1:
  case EVDF_PIXEL_SHADER_1_2:
  case EVDF_ARB_FRAGMENT_PROGRAM_1:
    bVar1 = this->FeatureAvailable[0x156] | this->FeatureAvailable[0x4b];
    break;
  case EVDF_TEXTURE_NPOT:
    bVar1 = this->FeatureAvailable[0x9c];
    break;
  case EVDF_FRAMEBUFFER_OBJECT:
    bVar1 = this->FeatureAvailable[0x4f] | this->FeatureAvailable[0xe6];
    break;
  case EVDF_VERTEX_BUFFER_OBJECT:
    bVar1 = this->FeatureAvailable[0xb2];
    break;
  case EVDF_ALPHA_TO_COVERAGE:
    bVar1 = this->FeatureAvailable[0x62];
    break;
  case EVDF_MULTIPLE_RENDER_TARGETS:
    bVar1 = this->FeatureAvailable[0xb9] | this->FeatureAvailable[0x3f];
    break;
  case EVDF_MRT_BLEND:
  case EVDF_MRT_COLOR_MASK:
    bVar1 = this->FeatureAvailable[0xdf];
    break;
  case EVDF_MRT_BLEND_FUNC:
    bVar1 = this->FeatureAvailable[7] | this->FeatureAvailable[0x40];
    break;
  case EVDF_GEOMETRY_SHADER:
    if (((this->FeatureAvailable[0x51] == false) && (this->FeatureAvailable[0xe8] == false)) &&
       (this->FeatureAvailable[0x15b] == false)) {
      bVar1 = this->FeatureAvailable[0x15c];
    }
    break;
  case EVDF_OCCLUSION_QUERY:
    bVar1 = this->OcclusionQuerySupport & this->FeatureAvailable[100];
    break;
  case EVDF_POLYGON_OFFSET:
    bVar2 = this->Version < 0x65;
LAB_001f21d5:
    bVar1 = !bVar2;
    break;
  case EVDF_BLEND_OPERATIONS:
    bVar1 = (this->Feature).BlendOperation;
    break;
  case EVDF_BLEND_SEPARATE:
    bVar1 = 0x67 < this->Version | this->FeatureAvailable[0xcf];
    break;
  case EVDF_TEXTURE_CUBEMAP:
    if ((this->Version < 0x67) && (this->FeatureAvailable[0x91] == false)) {
      bVar1 = this->FeatureAvailable[0x111];
    }
    break;
  case EVDF_TEXTURE_CUBEMAP_SEAMLESS:
    bVar1 = this->FeatureAvailable[0x71];
    break;
  case EVDF_DEPTH_CLAMP:
    bVar1 = this->FeatureAvailable[0x3c] | this->FeatureAvailable[0x14f];
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool COpenGLExtensionHandler::queryFeature(E_VIDEO_DRIVER_FEATURE feature) const
{
	switch (feature) {
	case EVDF_RENDER_TO_TARGET:
		return true;
	case EVDF_HARDWARE_TL:
		return true; // we cannot tell other things
	case EVDF_MULTITEXTURE:
		return Feature.MaxTextureUnits > 1;
	case EVDF_BILINEAR_FILTER:
		return true;
	case EVDF_MIP_MAP:
		return true;
	case EVDF_MIP_MAP_AUTO_UPDATE:
		return !IsAtiRadeonX && (FeatureAvailable[IRR_SGIS_generate_mipmap] || FeatureAvailable[IRR_EXT_framebuffer_object] || FeatureAvailable[IRR_ARB_framebuffer_object]);
	case EVDF_STENCIL_BUFFER:
		return StencilBuffer;
	case EVDF_VERTEX_SHADER_1_1:
	case EVDF_ARB_VERTEX_PROGRAM_1:
		return FeatureAvailable[IRR_ARB_vertex_program] || FeatureAvailable[IRR_NV_vertex_program1_1];
	case EVDF_PIXEL_SHADER_1_1:
	case EVDF_PIXEL_SHADER_1_2:
	case EVDF_ARB_FRAGMENT_PROGRAM_1:
		return FeatureAvailable[IRR_ARB_fragment_program] || FeatureAvailable[IRR_NV_fragment_program];
	case EVDF_PIXEL_SHADER_2_0:
	case EVDF_VERTEX_SHADER_2_0:
	case EVDF_ARB_GLSL:
		return (FeatureAvailable[IRR_ARB_shading_language_100] || Version >= 200);
	case EVDF_TEXTURE_NSQUARE:
		return true; // non-square is always supported
	case EVDF_TEXTURE_NPOT:
		// Some ATI cards seem to have only SW support in OpenGL 2.0
		// drivers if the extension is not exposed, so we skip this
		// extra test for now!
		// return (FeatureAvailable[IRR_ARB_texture_non_power_of_two]||Version>=200);
		return (FeatureAvailable[IRR_ARB_texture_non_power_of_two]);
	case EVDF_FRAMEBUFFER_OBJECT:
		return FeatureAvailable[IRR_EXT_framebuffer_object] || FeatureAvailable[IRR_ARB_framebuffer_object];
	case EVDF_VERTEX_BUFFER_OBJECT:
		return FeatureAvailable[IRR_ARB_vertex_buffer_object];
	case EVDF_COLOR_MASK:
		return true;
	case EVDF_ALPHA_TO_COVERAGE:
		return FeatureAvailable[IRR_ARB_multisample];
	case EVDF_GEOMETRY_SHADER:
		return FeatureAvailable[IRR_ARB_geometry_shader4] || FeatureAvailable[IRR_EXT_geometry_shader4] || FeatureAvailable[IRR_NV_geometry_program4] || FeatureAvailable[IRR_NV_geometry_shader4];
	case EVDF_MULTIPLE_RENDER_TARGETS:
		return FeatureAvailable[IRR_ARB_draw_buffers] || FeatureAvailable[IRR_ATI_draw_buffers];
	case EVDF_MRT_BLEND:
	case EVDF_MRT_COLOR_MASK:
		return FeatureAvailable[IRR_EXT_draw_buffers2];
	case EVDF_MRT_BLEND_FUNC:
		return FeatureAvailable[IRR_ARB_draw_buffers_blend] || FeatureAvailable[IRR_AMD_draw_buffers_blend];
	case EVDF_OCCLUSION_QUERY:
		return FeatureAvailable[IRR_ARB_occlusion_query] && OcclusionQuerySupport;
	case EVDF_POLYGON_OFFSET:
		// both features supported with OpenGL 1.1
		return Version >= 101;
	case EVDF_BLEND_OPERATIONS:
		return Feature.BlendOperation;
	case EVDF_BLEND_SEPARATE:
		return (Version >= 104) || FeatureAvailable[IRR_EXT_blend_func_separate];
	case EVDF_TEXTURE_MATRIX:
		return true;
	case EVDF_TEXTURE_CUBEMAP:
		return (Version >= 103) || FeatureAvailable[IRR_ARB_texture_cube_map] || FeatureAvailable[IRR_EXT_texture_cube_map];
	case EVDF_TEXTURE_CUBEMAP_SEAMLESS:
		return FeatureAvailable[IRR_ARB_seamless_cube_map];
	case EVDF_DEPTH_CLAMP:
		return FeatureAvailable[IRR_NV_depth_clamp] || FeatureAvailable[IRR_ARB_depth_clamp];

	default:
		return false;
	};
}